

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<int,(char)44>
               (char *string_ptr,idx_t string_size,int *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  char *pcVar9;
  char *buf;
  int iVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ExponentData exponent;
  bool local_4c;
  bool local_4b;
  IntegerCastData<short> local_4a;
  DecimalCastData<int> local_48;
  ulong local_38;
  
  bVar17 = false;
  local_48.result = 0;
  local_48.digit_count = '\0';
  local_48.decimal_count = '\0';
  local_48.round_set = false;
  local_48.should_round = false;
  uVar2 = local_48._6_4_;
  local_48.excessive_decimals = '\0';
  local_48.exponent_type = NONE;
  local_48.limit =
       *(StoreType_conflict *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) goto LAB_0168eee5;
  uVar7 = 0;
  do {
    bVar11 = string_ptr[uVar7];
    if ((4 < bVar11 - 9) && (bVar11 != 0x20)) {
      local_48.digit_count = 0;
      local_48.decimal_count = 0;
      bVar13 = local_48.decimal_count;
      local_48.width = width;
      local_48.scale = scale;
      if (bVar11 == 0x2d) {
        local_48.result = 0;
        uVar6 = string_size - uVar7;
        uVar3 = 1;
        goto LAB_0168e7e0;
      }
      if (bVar11 == 0x30 && string_size - 1 != uVar7) {
        bVar1 = string_ptr[uVar7 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_0168ea24:
            if (0xfffffffffffffffd < (string_size - uVar7) - 3) {
              local_48._6_4_ = uVar2;
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_48);
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_0168ea24;
      }
      uVar6 = string_size - uVar7;
      uVar4 = (ulong)(bVar11 == 0x2b);
      local_48.result = 0;
      uVar3 = uVar4;
      goto LAB_0168ea69;
    }
    uVar7 = uVar7 + 1;
  } while (string_size != uVar7);
  goto LAB_0168eee3;
LAB_0168e7e0:
  do {
    if (uVar6 <= uVar3) {
      local_48._7_3_ = 0;
      goto LAB_0168e8e8;
    }
    bVar11 = string_ptr[uVar7 + uVar3] - 0x30;
    if (9 < bVar11) {
      local_48._7_3_ = 0;
      if (string_ptr[uVar7 + uVar3] != ',') goto LAB_0168eca9;
      uVar4 = uVar3 + 1;
      iVar14 = 3;
      uVar5 = uVar4;
      if (uVar6 <= uVar4) goto LAB_0168ec7e;
      local_4c = false;
      local_4b = false;
      goto LAB_0168e95c;
    }
    uVar4 = uVar3 + 1;
    if ((bVar11 == 0) && (local_48.result == 0)) {
LAB_0168e80d:
      bVar17 = true;
      if ((~uVar3 + string_size != uVar7) && (string_ptr[uVar7 + 1 + uVar3] == '_')) {
        uVar4 = uVar3 + 2;
        if ((string_size - uVar3) - 2 == uVar7) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar7 + uVar4] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_48.digit_count) &&
         (local_48.digit_count = local_48.digit_count + 1, -0xccccccd < local_48.result)) {
        local_48.result = local_48.result * 10 - (uint)bVar11;
        goto LAB_0168e80d;
      }
      bVar17 = false;
    }
    uVar3 = uVar4;
  } while (bVar17);
  goto LAB_0168eee3;
  while (uVar5 = uVar15, uVar15 < uVar6) {
LAB_0168e95c:
    bVar11 = string_ptr[uVar7 + uVar5] - 0x30;
    local_38 = uVar4;
    if (9 < bVar11) {
      iVar14 = 0;
      goto LAB_0168ec5b;
    }
    if ((bVar13 == scale) && (local_4c == false)) {
      local_4b = 4 < bVar11;
      local_4c = true;
    }
    bVar17 = (uint)bVar13 + (uint)local_48.digit_count < 9;
    iVar14 = local_48.result * 10 - (uint)bVar11;
    if (!bVar17) {
      iVar14 = local_48.result;
    }
    local_48.result = iVar14;
    bVar13 = bVar13 + bVar17;
    uVar15 = uVar5 + 1;
    if (((~uVar5 + string_size != uVar7) && (string_ptr[uVar7 + 1 + uVar5] == '_')) &&
       ((uVar15 = uVar5 + 2, (string_size - uVar5) - 2 == uVar7 ||
        (9 < (byte)(string_ptr[uVar7 + uVar15] - 0x30U))))) {
      local_48.decimal_count = bVar13;
      local_48.round_set = local_4c;
      local_48.should_round = local_4b;
      uVar5 = uVar15;
      iVar10 = 1;
      goto LAB_0168ec96;
    }
  }
  iVar14 = 3;
LAB_0168ec5b:
  local_48.decimal_count = bVar13;
  local_48.round_set = local_4c;
  local_48.should_round = local_4b;
LAB_0168ec7e:
  iVar10 = 1;
  if (uVar4 < uVar5) {
    iVar10 = iVar14;
  }
  if (1 < uVar3) {
    iVar10 = iVar14;
  }
LAB_0168ec96:
  uVar3 = uVar5;
  if (iVar10 != 3) {
    if (iVar10 != 0) goto LAB_0168eee3;
LAB_0168eca9:
    bVar11 = string_ptr[uVar7 + uVar3];
    bVar17 = false;
    uVar12 = (uint)bVar11;
    if (bVar11 < 0x20) {
      if (4 < uVar12 - 9) goto LAB_0168eee5;
    }
    else {
      if ((bVar11 == 0x65) || (uVar12 == 0x45)) {
        if ((uVar3 != 1) && (uVar3 + 1 < uVar6)) {
          local_4a.result = 0;
          pcVar9 = string_ptr + uVar7 + uVar3 + 1;
          iVar8 = ~uVar7 + (string_size - uVar3);
          if (*pcVar9 == '-') {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar9,iVar8,&local_4a,SUB81(uVar6,0));
          }
          else {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar9,iVar8,&local_4a,SUB81(uVar6,0));
          }
          if (bVar17 != false) {
            bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                               (&local_48,(int)local_4a.result);
            goto LAB_0168eee5;
          }
        }
        goto LAB_0168eee3;
      }
      if (uVar12 != 0x20) goto LAB_0168eee5;
    }
    uVar4 = uVar3 + 1;
    uVar3 = uVar4;
    if (uVar4 < uVar6) {
      do {
        if ((4 < (byte)string_ptr[uVar7 + uVar4] - 9) && (string_ptr[uVar7 + uVar4] != 0x20))
        goto LAB_0168eee3;
        uVar4 = uVar4 + 1;
        uVar3 = uVar6;
      } while (uVar6 != uVar4);
    }
  }
LAB_0168e8e8:
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_48);
  if (bVar17) {
    bVar17 = 1 < uVar3;
    goto LAB_0168eee5;
  }
  goto LAB_0168eee3;
LAB_0168ea69:
  do {
    if (uVar6 <= uVar3) {
      local_48._7_3_ = 0;
      goto LAB_0168eb2d;
    }
    bVar11 = string_ptr[uVar7 + uVar3] - 0x30;
    if (9 < bVar11) {
      local_48._7_3_ = 0;
      if (string_ptr[uVar7 + uVar3] != ',') goto LAB_0168edaf;
      uVar5 = uVar3 + 1;
      iVar14 = 3;
      uVar15 = uVar5;
      if (uVar6 <= uVar5) goto LAB_0168ed85;
      local_4c = false;
      local_4b = false;
      goto LAB_0168eb9b;
    }
    uVar5 = uVar3 + 1;
    if ((bVar11 == 0) && (local_48.result == 0)) {
LAB_0168ea96:
      bVar17 = true;
      if ((~uVar3 + string_size != uVar7) && (string_ptr[uVar7 + 1 + uVar3] == '_')) {
        uVar5 = uVar3 + 2;
        if ((string_size - uVar3) - 2 == uVar7) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar7 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_48.digit_count) &&
         (local_48.digit_count = local_48.digit_count + 1, local_48.result < 0xccccccd)) {
        local_48.result = (uint)bVar11 + local_48.result * 10;
        goto LAB_0168ea96;
      }
      bVar17 = false;
    }
    uVar3 = uVar5;
  } while (bVar17);
  goto LAB_0168eee3;
  while (uVar15 = uVar16, uVar16 < uVar6) {
LAB_0168eb9b:
    bVar11 = string_ptr[uVar7 + uVar15] - 0x30;
    local_38 = uVar5;
    if (9 < bVar11) {
      iVar14 = 0;
      goto LAB_0168ed62;
    }
    if ((bVar13 == scale) && (local_4c == false)) {
      local_4b = 4 < bVar11;
      local_4c = true;
    }
    bVar17 = (uint)bVar13 + (uint)local_48.digit_count < 9;
    iVar14 = (uint)bVar11 + local_48.result * 10;
    if (!bVar17) {
      iVar14 = local_48.result;
    }
    local_48.result = iVar14;
    bVar13 = bVar13 + bVar17;
    uVar16 = uVar15 + 1;
    if (((~uVar15 + string_size != uVar7) && (string_ptr[uVar7 + 1 + uVar15] == '_')) &&
       ((uVar16 = uVar15 + 2, (string_size - uVar15) - 2 == uVar7 ||
        (9 < (byte)(string_ptr[uVar7 + uVar16] - 0x30U))))) {
      local_48.decimal_count = bVar13;
      local_48.round_set = local_4c;
      local_48.should_round = local_4b;
      uVar15 = uVar16;
      iVar10 = 1;
      goto LAB_0168ed9c;
    }
  }
  iVar14 = 3;
LAB_0168ed62:
  local_48.decimal_count = bVar13;
  local_48.round_set = local_4c;
  local_48.should_round = local_4b;
LAB_0168ed85:
  iVar10 = 1;
  if (uVar5 < uVar15) {
    iVar10 = iVar14;
  }
  if (uVar4 < uVar3) {
    iVar10 = iVar14;
  }
LAB_0168ed9c:
  uVar3 = uVar15;
  if (iVar10 != 3) {
    if (iVar10 != 0) goto LAB_0168eee3;
LAB_0168edaf:
    pcVar9 = string_ptr + uVar3;
    bVar11 = pcVar9[uVar7];
    bVar17 = false;
    uVar12 = (uint)bVar11;
    if (bVar11 < 0x20) {
      if (4 < uVar12 - 9) goto LAB_0168eee5;
    }
    else {
      if ((bVar11 == 0x65) || (uVar12 == 0x45)) {
        if ((uVar3 != uVar4) && (uVar3 + 1 < uVar6)) {
          local_4a.result = 0;
          buf = pcVar9 + uVar7 + 1;
          iVar8 = ~uVar7 + (string_size - uVar3);
          if (*buf == '-') {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (buf,iVar8,&local_4a,SUB81(pcVar9,0));
          }
          else {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (buf,iVar8,&local_4a,SUB81(pcVar9,0));
          }
          if (bVar17 != false) {
            bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                               (&local_48,(int)local_4a.result);
            goto LAB_0168eee5;
          }
        }
        goto LAB_0168eee3;
      }
      if (uVar12 != 0x20) goto LAB_0168eee5;
    }
    uVar5 = uVar3 + 1;
    uVar3 = uVar5;
    if (uVar5 < uVar6) {
      do {
        if ((4 < (byte)string_ptr[uVar7 + uVar5] - 9) && (string_ptr[uVar7 + uVar5] != 0x20))
        goto LAB_0168eee3;
        uVar5 = uVar5 + 1;
        uVar3 = uVar6;
      } while (uVar6 != uVar5);
    }
  }
LAB_0168eb2d:
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_48);
  if (bVar17) {
    bVar17 = uVar4 < uVar3;
    goto LAB_0168eee5;
  }
LAB_0168eee3:
  bVar17 = false;
LAB_0168eee5:
  if (bVar17 != false) {
    *result = local_48.result;
  }
  return bVar17;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}